

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O2

Image * __thiscall nv::FloatImage::createImageGammaCorrect(FloatImage *this,float gamma)

{
  float fVar1;
  ushort uVar2;
  ushort uVar3;
  AutoPtr<nv::Image> AVar4;
  int iVar5;
  Image *this_00;
  anon_union_4_2_12391d8d_for_Color32_0 *paVar6;
  uint uVar7;
  uint idx;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  float *pfVar12;
  bool bVar13;
  float __y;
  float fVar14;
  float fVar15;
  float fVar16;
  AutoPtr<nv::Image> img;
  
  if (this->m_componentNum != 4) {
    iVar5 = nvAbort("m_componentNum == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/FloatImage.cpp"
                    ,0x76,"Image *nv::FloatImage::createImageGammaCorrect(float) const");
    if (iVar5 == 1) {
      raise(5);
    }
  }
  this_00 = (Image *)operator_new(0x18);
  Image::Image(this_00);
  img.m_ptr = this_00;
  Image::allocate(this_00,(uint)this->m_width,(uint)this->m_height);
  pfVar12 = this->m_mem;
  uVar2 = this->m_width;
  uVar3 = this->m_height;
  uVar10 = (uint)uVar3 * (uint)uVar2;
  uVar11 = (ulong)uVar10;
  __y = 1.0 / gamma;
  idx = 0;
  while (AVar4.m_ptr = img.m_ptr, bVar13 = uVar11 != 0, uVar11 = uVar11 - 1, bVar13) {
    fVar14 = powf(*pfVar12,__y);
    fVar15 = powf(pfVar12[(ulong)uVar2 * (ulong)uVar3],__y);
    fVar16 = powf(pfVar12[uVar10 * 2],__y);
    fVar1 = pfVar12[uVar10 * 3];
    paVar6 = &Image::pixel(img.m_ptr,idx)->field_0;
    iVar5 = (int)(fVar1 * 255.0);
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    if (0xfe < iVar5) {
      iVar5 = 0xff;
    }
    uVar7 = (uint)(fVar16 * 255.0);
    if ((int)uVar7 < 1) {
      uVar7 = 0;
    }
    if (0xfe < (int)uVar7) {
      uVar7 = 0xff;
    }
    iVar8 = (int)(fVar15 * 255.0);
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    if (0xfe < iVar8) {
      iVar8 = 0xff;
    }
    iVar9 = (int)(fVar14 * 255.0);
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (0xfe < iVar9) {
      iVar9 = 0xff;
    }
    *paVar6 = (anon_union_4_2_12391d8d_for_Color32_0)
              (iVar8 << 8 | uVar7 | iVar9 << 0x10 | iVar5 << 0x18);
    pfVar12 = pfVar12 + 1;
    idx = idx + 1;
  }
  img.m_ptr = (Image *)0x0;
  AutoPtr<nv::Image>::~AutoPtr(&img);
  return AVar4.m_ptr;
}

Assistant:

Image * FloatImage::createImageGammaCorrect(float gamma/*= 2.2f*/) const
{
	nvCheck(m_componentNum == 4);
	
	AutoPtr<Image> img(new Image());
	img->allocate(m_width, m_height);
	
	const float * rChannel = this->channel(0);
	const float * gChannel = this->channel(1);
	const float * bChannel = this->channel(2);
	const float * aChannel = this->channel(3);

	const uint size = m_width * m_height;
	for(uint i = 0; i < size; i++)
	{
		const uint8 r = nv::clamp(int(255.0f * pow(rChannel[i], 1.0f/gamma)), 0, 255);
		const uint8 g = nv::clamp(int(255.0f * pow(gChannel[i], 1.0f/gamma)), 0, 255);
		const uint8 b = nv::clamp(int(255.0f * pow(bChannel[i], 1.0f/gamma)), 0, 255);
		const uint8 a = nv::clamp(int(255.0f * aChannel[i]), 0, 255);

		img->pixel(i) = Color32(r, g, b, a);
	}
	
	return img.release();
}